

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_string.cpp
# Opt level: O0

bool ublib::operator<=(Shared_string *lhs,Shared_string *rhs)

{
  bool bVar1;
  string_view __x;
  string_view __y;
  Shared_string *rhs_local;
  Shared_string *lhs_local;
  
  __x = Shared_string::operator_cast_to_basic_string_view(lhs);
  __y = Shared_string::operator_cast_to_basic_string_view(rhs);
  bVar1 = std::operator<=(__x,__y);
  return bVar1;
}

Assistant:

bool operator<=(Shared_string const& lhs, Shared_string const& rhs) noexcept {
  return std::string_view(lhs) <= std::string_view(rhs);
}